

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

void LZ4_writeLE16(void *memPtr,U16 value)

{
  uint uVar1;
  BYTE *p;
  U16 value_local;
  void *memPtr_local;
  
  uVar1 = LZ4_isLittleEndian();
  if (uVar1 == 0) {
    *(U16 *)memPtr = value;
  }
  else {
    LZ4_write16(memPtr,value);
  }
  return;
}

Assistant:

static void LZ4_writeLE16(void* memPtr, U16 value)
{
    if (LZ4_isLittleEndian()) {
        LZ4_write16(memPtr, value);
    } else {
        BYTE* p = (BYTE*)memPtr;
        p[0] = (BYTE) value;
        p[1] = (BYTE)(value>>8);
    }
}